

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O1

bool re2::IsValidCaptureName(StringPiece *name)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = name->length_;
  uVar3 = (ulong)uVar2;
  if (uVar3 == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = (int)uVar2 < 1;
    if (0 < (int)uVar2) {
      uVar4 = 1;
      do {
        cVar1 = name->ptr_[uVar4 - 1];
        if ((0x19 < (byte)(cVar1 + 0x9fU) && 9 < (byte)(cVar1 - 0x30U)) &&
           (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0xbfU))) {
          return bVar5;
        }
        bVar5 = uVar3 <= uVar4;
        bVar6 = uVar4 != uVar3;
        uVar4 = uVar4 + 1;
      } while (bVar6);
    }
  }
  return bVar5;
}

Assistant:

int size() const { return length_; }